

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<int,true,std::allocator<unsigned_long>>::
permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<int,true,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin)

{
  ulong uVar1;
  long lVar2;
  long *plVar3;
  bool bVar4;
  View<int,true,std::allocator<unsigned_long>> VVar5;
  runtime_error *prVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __v;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newStrides;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape;
  unsigned_long local_98;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_90;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
  if (*(long *)this == 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
  }
  else {
    if (*(long *)(this + 0x28) != 0) {
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_90._M_impl.super__Rb_tree_header._M_header;
      local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98 = 0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right =
           local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (*(long *)this != 0) {
        __v._M_current = begin._M_current;
        do {
          if (*(ulong *)(this + 0x28) <= local_98) {
            if ((local_60._M_impl.super__Rb_tree_header._M_node_count !=
                 local_90._M_impl.super__Rb_tree_header._M_node_count) ||
               (bVar4 = std::__equal<false>::
                        equal<std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>>
                                  ((_Rb_tree_const_iterator<unsigned_long>)
                                   local_60._M_impl.super__Rb_tree_header._M_header._M_left,
                                   (_Rb_tree_const_iterator<unsigned_long>)
                                   &local_60._M_impl.super__Rb_tree_header,
                                   (_Rb_tree_const_iterator<unsigned_long>)
                                   local_90._M_impl.super__Rb_tree_header._M_header._M_left), !bVar4
               )) {
              prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar6,"Assertion failed.");
              __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::~_Rb_tree(&local_90);
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::~_Rb_tree(&local_60);
            if (*(long *)this == 0) {
              prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar6,"Assertion failed.");
              goto LAB_0022b859;
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
                       *(size_type *)(this + 0x28),(allocator_type *)&local_90);
            if (*(long *)this == 0) {
              prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar6,"Assertion failed.");
              __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,
                       *(size_type *)(this + 0x28),(allocator_type *)&local_98);
            lVar7 = *(long *)this;
            if (lVar7 == 0) goto LAB_0022b5cb;
            lVar2 = *(long *)(this + 0x10);
            lVar8 = *(long *)(this + 0x20);
            uVar10 = 0;
            goto LAB_0022b591;
          }
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&local_60,&local_98);
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&local_90,__v._M_current);
          __v._M_current = __v._M_current + 1;
          local_98 = local_98 + 1;
        } while (*(long *)this != 0);
      }
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Assertion failed.");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
  }
LAB_0022b859:
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
LAB_0022b591:
  if (*(ulong *)(this + 0x28) <= uVar10) {
    if (*(long *)(this + 0x28) == 0) goto LAB_0022b634;
    lVar7 = *(long *)(this + 0x10);
    lVar2 = *(long *)(this + 0x20);
    uVar10 = 0;
    goto LAB_0022b607;
  }
  if (*(ulong *)(this + 0x28) <= begin._M_current[uVar10]) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
    goto LAB_0022b769;
  }
  *(undefined8 *)(local_60._M_impl._0_8_ + uVar10 * 8) =
       *(undefined8 *)(lVar2 + begin._M_current[uVar10] * 8);
  if (*(ulong *)(this + 0x28) <= begin._M_current[uVar10]) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
    goto LAB_0022b769;
  }
  *(undefined8 *)(local_90._M_impl._0_8_ + uVar10 * 8) =
       *(undefined8 *)(lVar8 + begin._M_current[uVar10] * 8);
  uVar10 = uVar10 + 1;
  if (lVar7 == 0) {
LAB_0022b5cb:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
LAB_0022b769:
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  goto LAB_0022b591;
  while( true ) {
    *(undefined8 *)(lVar2 + uVar10 * 8) = *(undefined8 *)(local_90._M_impl._0_8_ + uVar10 * 8);
    uVar10 = uVar10 + 1;
    if (*(ulong *)(this + 0x28) <= uVar10) break;
LAB_0022b607:
    if (*(ulong *)(this + 0x28) <= uVar10) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Assertion failed.");
LAB_0022b7b9:
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *(undefined8 *)(lVar7 + uVar10 * 8) = *(undefined8 *)(local_60._M_impl._0_8_ + uVar10 * 8);
    if (*(ulong *)(this + 0x28) <= uVar10) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Assertion failed.");
      goto LAB_0022b7b9;
    }
  }
LAB_0022b634:
  lVar7 = *(long *)(this + 0x28);
  if (lVar7 == 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar2 = *(long *)(this + 0x10);
  plVar3 = *(long **)(this + 0x18);
  if (*(int *)(this + 0x38) == 0) {
    plVar3[lVar7 + -1] = 1;
    if (lVar7 != 1) {
      lVar8 = plVar3[lVar7 + -1];
      do {
        lVar8 = lVar8 * *(long *)(lVar2 + -8 + lVar7 * 8);
        plVar3[lVar7 + -2] = lVar8;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 1);
    }
  }
  else {
    *plVar3 = 1;
    if (lVar7 != 1) {
      lVar8 = *plVar3;
      lVar9 = 0;
      do {
        lVar8 = lVar8 * *(long *)(lVar2 + lVar9 * 8);
        plVar3[lVar9 + 1] = lVar8;
        lVar9 = lVar9 + 1;
      } while (lVar7 + -1 != lVar9);
    }
  }
  uVar10 = *(ulong *)(this + 0x28);
  VVar5 = (View<int,true,std::allocator<unsigned_long>>)0x1;
  if (uVar10 != 0) {
    if (**(long **)(this + 0x18) == **(long **)(this + 0x20)) {
      uVar11 = 0;
      do {
        if (uVar10 - 1 == uVar11) goto LAB_0022b6e7;
        lVar7 = uVar11 + 1;
        uVar1 = uVar11 + 1;
        lVar2 = uVar11 + 1;
        uVar11 = uVar1;
      } while ((*(long **)(this + 0x18))[lVar7] == (*(long **)(this + 0x20))[lVar2]);
      this[0x3c] = (View<int,true,std::allocator<unsigned_long>>)0x0;
      if (uVar1 < uVar10) goto LAB_0022b6ea;
    }
    else {
      VVar5 = (View<int,true,std::allocator<unsigned_long>>)0x0;
    }
  }
LAB_0022b6e7:
  this[0x3c] = VVar5;
LAB_0022b6ea:
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
  if ((void *)local_90._M_impl._0_8_ != (void *)0x0) {
    operator_delete((void *)local_90._M_impl._0_8_,
                    (long)local_90._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_90._M_impl._0_8_);
  }
  if ((void *)local_60._M_impl._0_8_ != (void *)0x0) {
    operator_delete((void *)local_60._M_impl._0_8_,
                    (long)local_60._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_60._M_impl._0_8_);
  }
  return;
}

Assistant:

void
View<T, isConst, A>::permute
(
    CoordinateIterator begin
)
{
    testInvariant();
    if(!MARRAY_NO_ARG_TEST) {
        marray_detail::Assert(dimension() != 0);
        std::set<std::size_t> s1, s2;
        CoordinateIterator it = begin;
        for(std::size_t j=0; j<dimension(); ++j) {
            s1.insert(j);
            s2.insert(*it);
            ++it;
        }
        marray_detail::Assert(s1 == s2);
    }
    // update shape, shape strides, strides, and simplicity
    std::vector<std::size_t> newShape = std::vector<std::size_t>(dimension());
    std::vector<std::size_t> newStrides = std::vector<std::size_t>(dimension());
    for(std::size_t j=0; j<dimension(); ++j) {
        newShape[j] = geometry_.shape(static_cast<std::size_t>(*begin));
        newStrides[j] = geometry_.strides(static_cast<std::size_t>(*begin));
        ++begin;
    }
    for(std::size_t j=0; j<dimension(); ++j) {
        geometry_.shape(j) = newShape[j];
        geometry_.strides(j) = newStrides[j];
    }
    marray_detail::stridesFromShape(geometry_.shapeBegin(), geometry_.shapeEnd(),
        geometry_.shapeStridesBegin(), geometry_.coordinateOrder());
    updateSimplicity();
    testInvariant();
}